

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

string * __thiscall
spirv_cross::CompilerGLSL::bitcast_expression_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,BaseType target_type,uint32_t arg)

{
  SPIRType *pSVar1;
  char (*in_R9) [2];
  spirv_cross local_1b0 [32];
  string local_190;
  SPIRType target;
  
  to_expression_abi_cxx11_(__return_storage_ptr__,this,arg,true);
  pSVar1 = Compiler::expression_type(&this->super_Compiler,arg);
  if (*(BaseType *)&(pSVar1->super_IVariant).field_0xc != target_type) {
    SPIRType::SPIRType(&target,pSVar1);
    target.super_IVariant._12_4_ = target_type;
    (*(this->super_Compiler)._vptr_Compiler[0x38])(local_1b0,this,&target,pSVar1);
    join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
              (&local_190,local_1b0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3965df,
               (char (*) [2])__return_storage_ptr__,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x37f234,in_R9);
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_190);
    ::std::__cxx11::string::~string((string *)&local_190);
    ::std::__cxx11::string::~string((string *)local_1b0);
    SPIRType::~SPIRType(&target);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string CompilerGLSL::bitcast_expression(SPIRType::BaseType target_type, uint32_t arg)
{
	auto expr = to_expression(arg);
	auto &src_type = expression_type(arg);
	if (src_type.basetype != target_type)
	{
		auto target = src_type;
		target.basetype = target_type;
		expr = join(bitcast_glsl_op(target, src_type), "(", expr, ")");
	}

	return expr;
}